

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall PSEngine::advanced_movement_resolution(PSEngine *this)

{
  pointer p_containing_cell;
  bool bVar1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  reference __x;
  reference psVar2;
  reference this_02;
  shared_ptr<CompiledGame::PrimaryObject> local_158;
  undefined1 local_148 [8];
  shared_ptr<CompiledGame::PrimaryObject> obj;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
  *__range2_1;
  pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *pair;
  iterator __end2;
  iterator __begin2;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *__range2;
  vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
  objects_to_move;
  Cell *cell;
  iterator __end1;
  iterator __begin1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__range1;
  RuleDelta movement_deltas;
  PSEngine *this_local;
  
  movement_deltas.rule_application_deltas.
  super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RuleDelta::RuleDelta((RuleDelta *)&__range1);
  __range1._0_1_ = 1;
  this_00 = &(this->m_current_level).cells;
  __end1 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::begin(this_00);
  cell = (Cell *)std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                                     *)&cell), bVar1) {
    objects_to_move.
    super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                  ::operator*(&__end1);
    std::
    vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
    ::vector((vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
              *)&__range2);
    this_01 = &((objects_to_move.
                 super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount;
    __end2 = std::
             map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
             ::begin((map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                      *)this_01);
    pair = (pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
           std::
           map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
           ::end((map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                  *)this_01);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&pair), bVar1) {
      __x = std::
            _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
            ::operator*(&__end2);
      if (__x->second == Action) {
        __x->second = Stationary;
      }
      else if (__x->second != Stationary) {
        std::
        vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
        ::push_back((vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                     *)&__range2,&__x->first);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
               ::begin((vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                        *)&__range2);
    obj.super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
            ::end((vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
                   *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::shared_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>_>
                               *)&obj.
                                  super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar1) {
      psVar2 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>_>
               ::operator*(&__end2_1);
      std::shared_ptr<CompiledGame::PrimaryObject>::shared_ptr
                ((shared_ptr<CompiledGame::PrimaryObject> *)local_148,psVar2);
      p_containing_cell =
           objects_to_move.
           super__Vector_base<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::shared_ptr<CompiledGame::PrimaryObject>::shared_ptr
                (&local_158,(shared_ptr<CompiledGame::PrimaryObject> *)local_148);
      try_to_move_object(this,(Cell *)p_containing_cell,&local_158,(RuleDelta *)&__range1);
      std::shared_ptr<CompiledGame::PrimaryObject>::~shared_ptr(&local_158);
      std::shared_ptr<CompiledGame::PrimaryObject>::~shared_ptr
                ((shared_ptr<CompiledGame::PrimaryObject> *)local_148);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
    ::~vector((vector<std::shared_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::shared_ptr<CompiledGame::PrimaryObject>_>_>
               *)&__range2);
    __gnu_cxx::
    __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
    ::operator++(&__end1);
  }
  this_02 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::back
                      (&(this->m_turn_history).subturns);
  std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::push_back
            (&this_02->steps,(value_type *)&__range1);
  RuleDelta::~RuleDelta((RuleDelta *)&__range1);
  return true;
}

Assistant:

bool PSEngine::advanced_movement_resolution()
{
    RuleDelta movement_deltas;
    movement_deltas.is_movement_resolution = true;


    for(Cell& cell : m_current_level.cells)
    {
        vector<shared_ptr<CompiledGame::PrimaryObject>> objects_to_move;

        for(auto& pair : cell.objects )
        {
            if(pair.second == ObjectMoveType::Action)
            {
                //todo do we consider Action as a movement in the turn history ?
                pair.second = ObjectMoveType::Stationary;
            }
            else if(pair.second != ObjectMoveType::Stationary)
            {
                objects_to_move.push_back(pair.first);
            }
        }

        for(auto obj : objects_to_move)
        {
            if( !try_to_move_object(cell, obj, movement_deltas) )
            {
                //should return false only if the player can't move ?
            }
        }
    }

    m_turn_history.subturns.back().steps.push_back(movement_deltas);

    return true;
}